

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void tcg_gen_mulu2_i64_arm
               (TCGContext_conflict *tcg_ctx,TCGv_i64 rl,TCGv_i64 rh,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGOp *pTVar1;
  uintptr_t o_3;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_mulu2_i64);
  pTVar1->args[0] = (TCGArg)(rl + (long)tcg_ctx);
  pTVar1->args[1] = (TCGArg)(rh + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)(arg2 + (long)tcg_ctx);
  return;
}

Assistant:

void tcg_gen_mulu2_i64(TCGContext *tcg_ctx, TCGv_i64 rl, TCGv_i64 rh, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_HAS_mulu2_i64
        tcg_gen_op4_i64(tcg_ctx, INDEX_op_mulu2_i64, rl, rh, arg1, arg2);
#elif TCG_TARGET_HAS_muluh_i64
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_mul_i64, t, arg1, arg2);
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_muluh_i64, rh, arg1, arg2);
        tcg_gen_mov_i64(tcg_ctx, rl, t);
        tcg_temp_free_i64(tcg_ctx, t);
#else
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_mul_i64(tcg_ctx, t0, arg1, arg2);
        gen_helper_muluh_i64(tcg_ctx, rh, arg1, arg2);
        tcg_gen_mov_i64(tcg_ctx, rl, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#endif
}